

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

double __thiscall
TPZMatrix<double>::MatrixNorm(TPZMatrix<double> *this,int p,int64_t numiter,REAL tol)

{
  long rows;
  bool bVar1;
  ostream *poVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar8;
  TPZVec<double> ROW;
  TPZVec<double> EigenVal;
  TPZFMatrix<double> transp;
  double local_138;
  double local_128;
  REAL local_110;
  int64_t local_108;
  TPZVec<double> local_100;
  TPZVec<double> local_e0;
  TPZFMatrix<double> local_c0;
  
  rows = (this->super_TPZBaseMatrix).fRow;
  local_138 = 0.0;
  if (rows != 0) {
    local_110 = tol;
    local_108 = numiter;
    if (rows != (this->super_TPZBaseMatrix).fCol) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<>::MatrixNorm(int, int64_t, REAL) const [TVar = double]"
                              );
      poVar2 = std::operator<<(poVar2," - matrix must be square - Rows() = ");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      poVar2 = std::operator<<(poVar2," - Cols() = ");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    if (p == 0) {
      lVar7 = 0;
      lVar6 = 0;
      if (0 < rows) {
        lVar6 = rows;
      }
      local_138 = 0.0;
      for (; lVar7 != lVar6; lVar7 = lVar7 + 1) {
        dVar8 = 0.0;
        for (lVar5 = 0; rows != lVar5; lVar5 = lVar5 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar7,lVar5);
          dVar8 = dVar8 + ABS(extraout_XMM0_Qa_01);
        }
        local_138 = (double)(~-(ulong)(ABS(local_138) < dVar8) & (ulong)local_138 |
                            (ulong)dVar8 & -(ulong)(ABS(local_138) < dVar8));
      }
    }
    else if (p == 2) {
      TPZFMatrix<double>::TPZFMatrix(&local_c0,rows,rows);
      lVar7 = 0;
      lVar6 = 0;
      if (0 < rows) {
        lVar6 = rows;
      }
      for (; lVar7 != lVar6; lVar7 = lVar7 + 1) {
        for (lVar5 = 0; rows != lVar5; lVar5 = lVar5 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar5,lVar7);
          pdVar3 = TPZFMatrix<double>::operator()(&local_c0,lVar7,lVar5);
          *pdVar3 = extraout_XMM0_Qa_00;
        }
      }
      TPZVec<double>::TPZVec(&local_100,rows);
      for (lVar7 = 0; lVar7 != lVar6; lVar7 = lVar7 + 1) {
        for (lVar5 = 0; rows != lVar5; lVar5 = lVar5 + 1) {
          pdVar3 = TPZFMatrix<double>::operator()(&local_c0,lVar7,lVar5);
          local_100.fStore[lVar5] = *pdVar3;
        }
        for (lVar5 = 0; lVar5 != rows; lVar5 = lVar5 + 1) {
          local_128 = 0.0;
          for (lVar4 = 0; rows != lVar4; lVar4 = lVar4 + 1) {
            dVar8 = local_100.fStore[lVar4];
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar4,lVar5)
            ;
            local_128 = local_128 + dVar8 * extraout_XMM0_Qa_02;
          }
          pdVar3 = TPZFMatrix<double>::operator()(&local_c0,lVar7,lVar5);
          *pdVar3 = local_128;
        }
      }
      local_e0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649128;
      local_e0.fStore = (double *)0x0;
      local_e0.fNElements = 0;
      local_e0.fNAlloc = 0;
      bVar1 = SolveEigenvaluesJacobi
                        (&local_c0.super_TPZMatrix<double>,&local_108,&local_110,&local_e0);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "TVar TPZMatrix<>::MatrixNorm(int, int64_t, REAL) const [TVar = double]"
                                );
        poVar2 = std::operator<<(poVar2," - it was not possible to find Eigenvalues. Iterations = ")
        ;
        poVar2 = std::ostream::_M_insert<long>((long)poVar2);
        std::operator<<(poVar2," - error found = ");
        poVar2 = std::ostream::_M_insert<double>(local_110);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      local_138 = *local_e0.fStore;
      if (local_138 < 0.0) {
        local_138 = sqrt(local_138);
      }
      else {
        local_138 = SQRT(local_138);
      }
      TPZVec<double>::~TPZVec(&local_e0);
      TPZVec<double>::~TPZVec(&local_100);
      TPZFMatrix<double>::~TPZFMatrix(&local_c0);
    }
    else if (p == 1) {
      lVar7 = 0;
      lVar6 = 0;
      if (0 < rows) {
        lVar6 = rows;
      }
      local_138 = 0.0;
      for (; lVar7 != lVar6; lVar7 = lVar7 + 1) {
        dVar8 = 0.0;
        for (lVar5 = 0; rows != lVar5; lVar5 = lVar5 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar5,lVar7);
          dVar8 = dVar8 + ABS(extraout_XMM0_Qa);
        }
        local_138 = (double)(~-(ulong)(ABS(local_138) < dVar8) & (ulong)local_138 |
                            (ulong)dVar8 & -(ulong)(ABS(local_138) < dVar8));
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<>::MatrixNorm(int, int64_t, REAL) const [TVar = double]"
                              );
      poVar2 = std::operator<<(poVar2," p = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,p);
      poVar2 = std::operator<<(poVar2," is not a correct option");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  return local_138;
}

Assistant:

TVar TPZMatrix<TVar>::MatrixNorm(int p, int64_t numiter, REAL tol) const{
	const int64_t n = this->Rows();
	if (!n) return 0.;
	if (n != this->Cols()){
		PZError << __PRETTY_FUNCTION__
		<< " - matrix must be square - Rows() = "
		<< this->Rows() << " - Cols() = "
		<< this->Cols() << std::endl;
	}
	switch(p){
		case 0:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(i,j) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 1:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(j,i) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 2:{
			TPZFMatrix<TVar> transp(n,n);
			int64_t i, j, k;
			//TRANSPOSE
			for(i = 0; i < n; i++) for(j = 0; j < n; j++) transp(i,j) = this->Get(j,i);
			//MULTIPLY transp = transp.this
			TPZVec<TVar> ROW(n);
			for(i = 0; i < n; i++){
				for(j = 0; j < n; j++) ROW[j] = transp(i,j);
				for(j = 0; j < n; j++){
					TVar sum = 0.;
					for(k = 0; k < n; k++){
						sum += ROW[k] * this->Get(k,j);
					}//for k
					transp(i,j) = sum;
				}//for j
			}//for i
			
			TPZVec<TVar> EigenVal;
			bool result = transp.SolveEigenvaluesJacobi(numiter, tol, &EigenVal);
			if (result == false) PZError << __PRETTY_FUNCTION__
				<< " - it was not possible to find Eigenvalues. Iterations = "
				<< numiter << " - error found = " << tol << std::endl;
			return sqrt(EigenVal[0]);
		}//case 2
		default:{
			PZError << __PRETTY_FUNCTION__ << " p = " << p << " is not a correct option" << std::endl;
		}
	}//switch
	return 0.;
}